

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseStartTag(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  startElementSAXFunc p_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlChar *str1;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlChar **ppxVar12;
  char *msg;
  long lVar13;
  xmlChar **ppxVar14;
  xmlChar *local_50;
  uint local_38;
  
  if (ctxt->input == (xmlParserInputPtr)0x0) {
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"htmlParseStartTag: context error\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    return -1;
  }
  if (ctxt->instate == XML_PARSER_EOF) {
    return -1;
  }
  if (*ctxt->input->cur != '<') {
    return -1;
  }
  xmlNextChar(ctxt);
  ppxVar14 = ctxt->atts;
  local_50._0_4_ = ctxt->maxatts;
  if ((ctxt->progressive == 0) &&
     (pxVar3 = ctxt->input, (long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserInputGrow(pxVar3,0xfa);
  }
  str1 = htmlParseHTMLName(ctxt);
  if (str1 == (xmlChar *)0x0) {
    htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseStartTag: invalid element name\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    while( true ) {
      xVar1 = *ctxt->input->cur;
      if (xVar1 == '\0') {
        return -1;
      }
      if (xVar1 == '>') break;
      if (ctxt->instate == XML_PARSER_EOF) {
        return -1;
      }
      xmlNextChar(ctxt);
    }
    return -1;
  }
  iVar7 = xmlStrEqual(str1,(xmlChar *)"meta");
  htmlAutoClose(ctxt,str1);
  htmlCheckImplied(ctxt,str1);
  if (ctxt->nameNr < 1) {
    local_38 = 0;
  }
  else {
    iVar8 = xmlStrEqual(str1,"html");
    if (iVar8 != 0) {
      htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"htmlParseStartTag: misplaced <html> tag\n",str1,
                   (xmlChar *)0x0);
      ctxt->depth = ctxt->depth + 1;
    }
    local_38 = (uint)(iVar8 != 0);
    if (ctxt->nameNr == 1) goto LAB_0014b23f;
  }
  iVar8 = xmlStrEqual(str1,"head");
  if (iVar8 != 0) {
    htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"htmlParseStartTag: misplaced <head> tag\n",str1,
                 (xmlChar *)0x0);
    ctxt->depth = ctxt->depth + 1;
    local_38 = 1;
  }
LAB_0014b23f:
  iVar8 = xmlStrEqual(str1,"body");
  if ((iVar8 != 0) && (0 < ctxt->nameNr)) {
    lVar13 = 0;
    do {
      iVar8 = xmlStrEqual(ctxt->nameTab[lVar13],"body");
      if (iVar8 != 0) {
        htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"htmlParseStartTag: misplaced <body> tag\n",str1,
                     (xmlChar *)0x0);
        ctxt->depth = ctxt->depth + 1;
        local_38 = 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < ctxt->nameNr);
  }
  htmlSkipBlankChars(ctxt);
  iVar8 = 0;
  do {
    pxVar3 = ctxt->input;
    pxVar10 = pxVar3->cur;
    xVar1 = *pxVar10;
    if (xVar1 == '/') {
      xVar1 = pxVar10[1];
    }
    else if (xVar1 == '\0') {
LAB_0014b596:
      if ((((iVar7 != 0) && (iVar8 != 0)) && (ppxVar14 != (xmlChar **)0x0)) &&
         (pxVar10 = *ppxVar14, pxVar10 != (xmlChar *)0x0)) {
        local_50 = (xmlChar *)0x0;
        bVar6 = false;
        ppxVar12 = ppxVar14;
        do {
          pxVar11 = ppxVar12[1];
          if (pxVar11 != (xmlChar *)0x0) {
            iVar7 = xmlStrcasecmp(pxVar10,(xmlChar *)"http-equiv");
            if ((iVar7 == 0) &&
               (iVar7 = xmlStrcasecmp(pxVar11,(xmlChar *)"Content-Type"), iVar7 == 0)) {
              bVar6 = true;
            }
            else {
              iVar7 = xmlStrcasecmp(pxVar10,"charset");
              if (iVar7 == 0) {
                htmlCheckEncodingDirect(ctxt,pxVar11);
              }
              else {
                iVar7 = xmlStrcasecmp(pxVar10,"content");
                if (iVar7 == 0) {
                  local_50 = pxVar11;
                }
              }
            }
          }
          pxVar10 = ppxVar12[2];
          ppxVar12 = ppxVar12 + 2;
        } while (pxVar10 != (xmlChar *)0x0);
        if ((bVar6) && (local_50 != (xmlChar *)0x0)) {
          htmlCheckEncoding(ctxt,local_50);
        }
      }
      if (local_38 == 0) {
        htmlnamePush(ctxt,str1);
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (p_Var5 = ctxt->sax->startElement, p_Var5 != (startElementSAXFunc)0x0)) {
          if (iVar8 == 0) {
            (*p_Var5)(ctxt->userData,str1,(xmlChar **)0x0);
            return 0;
          }
          (*p_Var5)(ctxt->userData,str1,ppxVar14);
        }
      }
      if (1 < iVar8 && ppxVar14 != (xmlChar **)0x0) {
        lVar13 = 1;
        do {
          if (ppxVar14[lVar13] != (xmlChar *)0x0) {
            (*xmlFree)(ppxVar14[lVar13]);
          }
          lVar13 = lVar13 + 2;
        } while ((int)lVar13 < iVar8);
      }
      return local_38;
    }
    if (xVar1 == '>') goto LAB_0014b596;
    if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar10 < 0xfa)) {
      xmlParserInputGrow(pxVar3,0xfa);
    }
    pxVar10 = htmlParseHTMLName(ctxt);
    if (pxVar10 == (xmlChar *)0x0) {
      htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"error parsing attribute name\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
      while( true ) {
        pbVar4 = ctxt->input->cur;
        bVar2 = *pbVar4;
        if (((bVar2 & 0xdf) == 0) || ((byte)(bVar2 - 9) < 2)) break;
        if (bVar2 == 0x2f) {
          bVar2 = pbVar4[1];
        }
        else if (bVar2 == 0xd) break;
        if (bVar2 == 0x3e) break;
        xmlNextChar(ctxt);
      }
    }
    else {
      htmlSkipBlankChars(ctxt);
      if (*ctxt->input->cur == '=') {
        xmlNextChar(ctxt);
        htmlSkipBlankChars(ctxt);
        xVar1 = *ctxt->input->cur;
        if (xVar1 == '\'') {
          xmlNextChar(ctxt);
          pxVar11 = htmlParseHTMLAttribute(ctxt,'\'');
          if (*ctxt->input->cur != '\'') {
            msg = "AttValue: \' expected\n";
            goto LAB_0014b481;
          }
LAB_0014b43b:
          xmlNextChar(ctxt);
        }
        else if (xVar1 == '\"') {
          xmlNextChar(ctxt);
          pxVar11 = htmlParseHTMLAttribute(ctxt,'\"');
          if (*ctxt->input->cur == '\"') goto LAB_0014b43b;
          msg = "AttValue: \" expected\n";
LAB_0014b481:
          htmlParseErr(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,msg,(xmlChar *)0x0,(xmlChar *)0x0);
        }
        else {
          pxVar11 = htmlParseHTMLAttribute(ctxt,'\0');
          if (pxVar11 == (xmlChar *)0x0) {
            htmlParseErr(ctxt,XML_ERR_ATTRIBUTE_WITHOUT_VALUE,"AttValue: no value found\n",
                         (xmlChar *)0x0,(xmlChar *)0x0);
            goto LAB_0014b46d;
          }
        }
      }
      else {
LAB_0014b46d:
        pxVar11 = (xmlChar *)0x0;
      }
      if (iVar8 < 1) {
        if (ppxVar14 != (xmlChar **)0x0) goto LAB_0014b4b3;
        ppxVar12 = (xmlChar **)(*xmlMalloc)(0xb0);
        if (ppxVar12 == (xmlChar **)0x0) {
          htmlErrMemory(ctxt,(char *)0x0);
          local_50._0_4_ = 0x16;
          if (pxVar11 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar11);
          }
          ppxVar14 = (xmlChar **)0x0;
          goto LAB_0014b561;
        }
        local_50._0_4_ = 0x16;
LAB_0014b517:
        ctxt->atts = ppxVar12;
        ctxt->maxatts = (int)local_50;
        ppxVar14 = ppxVar12;
      }
      else {
        lVar13 = 0;
        do {
          iVar9 = xmlStrEqual(ppxVar14[lVar13],pxVar10);
          if (iVar9 != 0) {
            htmlParseErr(ctxt,XML_ERR_ATTRIBUTE_REDEFINED,"Attribute %s redefined\n",pxVar10,
                         (xmlChar *)0x0);
            goto LAB_0014b550;
          }
          lVar13 = lVar13 + 2;
        } while ((int)lVar13 < iVar8);
LAB_0014b4b3:
        if ((int)local_50 < iVar8 + 4) {
          local_50._0_4_ = (int)local_50 * 2;
          ppxVar12 = (xmlChar **)(*xmlRealloc)(ppxVar14,(long)(int)local_50 << 3);
          if (ppxVar12 == (xmlChar **)0x0) {
            htmlErrMemory(ctxt,(char *)0x0);
LAB_0014b550:
            if (pxVar11 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar11);
            }
            goto LAB_0014b561;
          }
          goto LAB_0014b517;
        }
      }
      ppxVar14[iVar8] = pxVar10;
      ppxVar14[(long)iVar8 + 1] = pxVar11;
      ppxVar14[(long)iVar8 + 2] = (xmlChar *)0x0;
      (ppxVar14 + (long)iVar8 + 2)[1] = (xmlChar *)0x0;
      iVar8 = iVar8 + 2;
    }
LAB_0014b561:
    htmlSkipBlankChars(ctxt);
  } while( true );
}

Assistant:

static int
htmlParseStartTag(htmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts;
    int nbatts = 0;
    int maxatts;
    int meta = 0;
    int i;
    int discardtag = 0;

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseStartTag: context error\n", NULL, NULL);
	return -1;
    }
    if (ctxt->instate == XML_PARSER_EOF)
        return(-1);
    if (CUR != '<') return -1;
    NEXT;

    atts = ctxt->atts;
    maxatts = ctxt->maxatts;

    GROW;
    name = htmlParseHTMLName(ctxt);
    if (name == NULL) {
	htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	             "htmlParseStartTag: invalid element name\n",
		     NULL, NULL);
	/* Dump the bogus tag like browsers do */
	while ((CUR != 0) && (CUR != '>') &&
               (ctxt->instate != XML_PARSER_EOF))
	    NEXT;
        return -1;
    }
    if (xmlStrEqual(name, BAD_CAST"meta"))
	meta = 1;

    /*
     * Check for auto-closure of HTML elements.
     */
    htmlAutoClose(ctxt, name);

    /*
     * Check for implied HTML elements.
     */
    htmlCheckImplied(ctxt, name);

    /*
     * Avoid html at any level > 0, head at any level != 1
     * or any attempt to recurse body
     */
    if ((ctxt->nameNr > 0) && (xmlStrEqual(name, BAD_CAST"html"))) {
	htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
	             "htmlParseStartTag: misplaced <html> tag\n",
		     name, NULL);
	discardtag = 1;
	ctxt->depth++;
    }
    if ((ctxt->nameNr != 1) &&
	(xmlStrEqual(name, BAD_CAST"head"))) {
	htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
	             "htmlParseStartTag: misplaced <head> tag\n",
		     name, NULL);
	discardtag = 1;
	ctxt->depth++;
    }
    if (xmlStrEqual(name, BAD_CAST"body")) {
	int indx;
	for (indx = 0;indx < ctxt->nameNr;indx++) {
	    if (xmlStrEqual(ctxt->nameTab[indx], BAD_CAST"body")) {
		htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
		             "htmlParseStartTag: misplaced <body> tag\n",
			     name, NULL);
		discardtag = 1;
		ctxt->depth++;
	    }
	}
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    while ((CUR != 0) &&
           (CUR != '>') &&
	   ((CUR != '/') || (NXT(1) != '>'))) {
	GROW;
	attname = htmlParseAttribute(ctxt, &attvalue);
        if (attname != NULL) {

	    /*
	     * Well formedness requires at most one declaration of an attribute
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    htmlParseErr(ctxt, XML_ERR_ATTRIBUTE_REDEFINED,
		                 "Attribute %s redefined\n", attname, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
	    }

	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    htmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    htmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	}
	else {
	    if (attvalue != NULL)
	        xmlFree(attvalue);
	    /* Dump the bogus attribute string up to the next blank or
	     * the end of the tag. */
	    while ((CUR != 0) &&
	           !(IS_BLANK_CH(CUR)) && (CUR != '>') &&
		   ((CUR != '/') || (NXT(1) != '>')))
		NEXT;
	}

failed:
	SKIP_BLANKS;
    }

    /*
     * Handle specific association to the META tag
     */
    if (meta && (nbatts != 0))
	htmlCheckMeta(ctxt, atts);

    /*
     * SAX: Start of Element !
     */
    if (!discardtag) {
	htmlnamePush(ctxt, name);
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL)) {
	    if (nbatts != 0)
		ctxt->sax->startElement(ctxt->userData, name, atts);
	    else
		ctxt->sax->startElement(ctxt->userData, name, NULL);
	}
    }

    if (atts != NULL) {
        for (i = 1;i < nbatts;i += 2) {
	    if (atts[i] != NULL)
		xmlFree((xmlChar *) atts[i]);
	}
    }

    return(discardtag);
}